

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix4 * matrix4_set_from_euler_anglesf3_EXP(matrix4 *self,float x,float y,float z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  dVar1 = cos((double)x);
  dVar2 = sin((double)x);
  dVar3 = cos((double)y);
  fVar4 = (float)dVar3;
  dVar3 = sin((double)y);
  fVar5 = (float)dVar3;
  dVar3 = cos((double)z);
  fVar6 = (float)dVar3;
  dVar3 = sin((double)z);
  fVar7 = (float)dVar3;
  (self->field_0).m[0] = fVar4 * fVar6;
  (self->field_0).m[4] = -fVar4 * fVar7;
  (self->field_0).m[8] = fVar5;
  fVar8 = (float)dVar1;
  fVar9 = (float)dVar2;
  *(ulong *)((long)&self->field_0 + 4) =
       CONCAT44(-(fVar8 * fVar5) * fVar6 + fVar7 * fVar9,fVar5 * fVar9 * fVar6 + fVar7 * fVar8);
  *(ulong *)((long)&self->field_0 + 0x14) =
       CONCAT44(fVar8 * fVar5 * fVar7 + fVar6 * fVar9,-(fVar5 * fVar9) * fVar7 + fVar6 * fVar8);
  *(ulong *)((long)&self->field_0 + 0x24) = CONCAT44(fVar4 * fVar8,fVar4 * -fVar9);
  (self->field_0).m[3] = 0.0;
  (self->field_0).m[7] = 0.0;
  *(undefined8 *)((long)&self->field_0 + 0x2c) = 0;
  *(undefined8 *)((long)&self->field_0 + 0x34) = 0;
  (self->field_0).m[0xf] = 1.0;
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_set_from_euler_anglesf3_EXP(struct matrix4 *self, const HYP_FLOAT x, const HYP_FLOAT y, const HYP_FLOAT z)
{
	HYP_FLOAT A = HYP_COS(x);
	HYP_FLOAT B = HYP_SIN(x);
	HYP_FLOAT C = HYP_COS(y);
	HYP_FLOAT D = HYP_SIN(y);
	HYP_FLOAT E = HYP_COS(z);
	HYP_FLOAT F = HYP_SIN(z);

	HYP_FLOAT AD = A * D;
	HYP_FLOAT BD = B * D;

	self->c00 = C * E;
	self->c01 = -C * F;
	self->c02 = D;
	self->c03 = 0.0f;

	self->c10 = BD * E + A * F;
	self->c11 = -BD * F + A * E;
	self->c12 = -B * C;
	self->c13 = 0.0f;

	self->c20 = -AD * E + B * F;
	self->c21 = AD * F + B * E;
	self->c22 = A * C;
	self->c23 = 0.0f;

	self->c30 = 0.0f;
	self->c31 = 0.0f;
	self->c32 = 0.0f;
	self->c33 = 1.0f;

	return self;
}